

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  byte bVar1;
  size_t sVar2;
  CURLcode CVar3;
  undefined8 in_RAX;
  char *pcVar4;
  byte *pbVar5;
  byte *pbVar6;
  size_t sVar7;
  undefined7 in_register_00000009;
  size_t len_00;
  bool bVar8;
  char *pcVar9;
  bool bVar10;
  undefined8 uStack_38;
  
  pbVar5 = (byte *)url;
  uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000009,relative) == 0) {
    pcVar4 = strstr(url,"//");
    pcVar9 = pcVar4 + 2;
    if (pcVar4 == (char *)0x0) {
      pcVar9 = url;
    }
    pbVar5 = (byte *)strchr(pcVar9,0x3f);
    pbVar6 = (byte *)strchr(pcVar9,0x2f);
    if (pbVar6 == (byte *)0x0) {
      sVar7 = strlen(url);
      pbVar6 = (byte *)(url + sVar7);
    }
    if (pbVar5 == (byte *)0x0) {
      sVar7 = strlen(url);
      pbVar5 = (byte *)(url + sVar7);
    }
    if (pbVar6 < pbVar5) {
      pbVar5 = pbVar6;
    }
  }
  bVar8 = !query;
  sVar2 = 1;
  do {
    bVar10 = len == 0;
    len = len - 1;
    if (bVar10) {
      return CURLUE_OK;
    }
    len_00 = sVar2;
    pcVar9 = url;
    if (pbVar5 <= url) {
      bVar1 = *url;
      if (bVar1 == 0x3f) {
        bVar8 = false;
      }
      else if (bVar1 == 0x20) {
        if (bVar8) {
          pcVar9 = "%20";
          goto LAB_0015df03;
        }
        pcVar9 = "+";
      }
      else if ((((0x1f < bVar1) && (bVar1 != 0x20)) && (bVar1 != 0x7f)) && (0x7e < bVar1)) {
        uStack_38 = CONCAT17("0123456789abcdef"[bVar1 & 0xf],
                             CONCAT16("0123456789abcdef"[bVar1 >> 4],
                                      CONCAT15(0x25,(undefined5)uStack_38)));
        pcVar9 = (char *)((long)&uStack_38 + 5);
LAB_0015df03:
        len_00 = 3;
      }
    }
    CVar3 = Curl_dyn_addn(o,pcVar9,len_00);
    if (CVar3 != CURLE_OK) {
      if (CVar3 != CURLE_TOO_LARGE) {
        return CURLUE_OUT_OF_MEMORY;
      }
      return CURLUE_TOO_LARGE;
    }
    url = (char *)((byte *)url + 1);
  } while( true );
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;
  CURLcode result;

  if(!relative)
    host_sep = (const unsigned char *) find_host_sep(url);

  for(iptr = (unsigned char *)url;    /* read from here */
      len; iptr++, len--) {

    if(iptr < host_sep) {
      result = Curl_dyn_addn(o, iptr, 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == ' ') {
      if(left)
        result = Curl_dyn_addn(o, "%20", 3);
      else
        result = Curl_dyn_addn(o, "+", 1);
      if(result)
        return cc2cu(result);
      continue;
    }

    if(*iptr == '?')
      left = FALSE;

    if(urlchar_needs_escaping(*iptr)) {
      char out[3]={'%'};
      out[1] = hexdigits[*iptr>>4];
      out[2] = hexdigits[*iptr & 0xf];
      result = Curl_dyn_addn(o, out, 3);
    }
    else
      result = Curl_dyn_addn(o, iptr, 1);
    if(result)
      return cc2cu(result);
  }

  return CURLUE_OK;
}